

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O3

void __thiscall
QGraphicsSceneBspTreeIndexPrivate::_q_updateIndex(QGraphicsSceneBspTreeIndexPrivate *this)

{
  QList<QGraphicsItem_*> *this_00;
  int **ppiVar1;
  qsizetype *pqVar2;
  QGraphicsItem *pQVar3;
  qsizetype i;
  QGraphicsItemPrivate *this_01;
  int iVar4;
  iterator iVar5;
  pointer ppQVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  long in_FS_OFFSET;
  double dVar11;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->indexTimer).m_id == Invalid) goto LAB_00622cbe;
  QBasicTimer::stop();
  purgeRemovedItems(this);
  if ((this->unindexedItems).d.size != 0) {
    this_00 = &this->indexedItems;
    uVar9 = 0;
    do {
      pQVar3 = (this->unindexedItems).d.ptr[uVar9];
      if (pQVar3 != (QGraphicsItem *)0x0) {
        if ((this->freeItemIndexes).d.size == 0) {
          i = (this->indexedItems).d.size;
          ((pQVar3->d_ptr).d)->index = (int)i;
          local_58.xp = (qreal)pQVar3;
          QtPrivate::QPodArrayOps<QGraphicsItem*>::emplace<QGraphicsItem*&>
                    ((QPodArrayOps<QGraphicsItem*> *)this_00,i,(QGraphicsItem **)&local_58);
          QList<QGraphicsItem_*>::end(this_00);
        }
        else {
          iVar5 = QList<int>::begin(&this->freeItemIndexes);
          iVar8 = *iVar5.i;
          ppiVar1 = &(this->freeItemIndexes).d.ptr;
          *ppiVar1 = *ppiVar1 + 1;
          pqVar2 = &(this->freeItemIndexes).d.size;
          *pqVar2 = *pqVar2 + -1;
          ((pQVar3->d_ptr).d)->index = iVar8;
          ppQVar6 = QList<QGraphicsItem_*>::data(this_00);
          ppQVar6[iVar8] = pQVar3;
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)(this->unindexedItems).d.size);
  }
  if (this->bspTreeDepth == 0) {
    iVar8 = 0;
    if (0 < this->lastItemCount) {
      dVar11 = log((double)this->lastItemCount);
      dVar11 = ceil(dVar11 / 0.6931471805599453);
      iVar8 = 5;
      if (5 < (int)dVar11) {
        iVar8 = (int)dVar11;
      }
    }
    iVar4 = (int)(this->indexedItems).d.size;
    iVar10 = 0;
    if (0 < iVar4) {
      dVar11 = log((double)iVar4);
      dVar11 = ceil(dVar11 / 0.6931471805599453);
      iVar10 = 5;
      if (5 < (int)dVar11) {
        iVar10 = (int)dVar11;
      }
    }
    this->bspTreeDepth = iVar10;
    iVar4 = QGraphicsSceneBspTree::leafCount(&this->bsp);
    if (iVar4 == 0) {
LAB_00622bc0:
      this->regenerateIndex = true;
    }
    else if (iVar8 != this->bspTreeDepth) {
      uVar7 = (long)this->lastItemCount - (this->indexedItems).d.size;
      uVar9 = -uVar7;
      if (0 < (long)uVar7) {
        uVar9 = uVar7;
      }
      if (100 < uVar9) goto LAB_00622bc0;
    }
  }
  if (this->regenerateIndex == true) {
    this->regenerateIndex = false;
    QGraphicsSceneBspTree::initialize(&this->bsp,&this->sceneRect,this->bspTreeDepth);
    QArrayDataPointer<QGraphicsItem_*>::operator=(&(this->unindexedItems).d,&(this->indexedItems).d)
    ;
    this->lastItemCount = (int)(this->indexedItems).d.size;
  }
  if ((this->unindexedItems).d.size != 0) {
    uVar9 = 0;
    do {
      pQVar3 = (this->unindexedItems).d.ptr[uVar9];
      if (pQVar3 != (QGraphicsItem *)0x0) {
        this_01 = (pQVar3->d_ptr).d;
        uVar7 = *(ulong *)&this_01->field_0x160;
        if ((uVar7 & 0x2000040000) == 0) {
          if ((uVar7 & 0x120000) == 0) {
            QGraphicsItemPrivate::sceneEffectiveBoundingRect(&local_58,this_01);
            QGraphicsSceneBspTree::insertItem(&this->bsp,pQVar3,&local_58);
          }
        }
        else {
          local_58.xp = (qreal)pQVar3;
          QtPrivate::QPodArrayOps<QGraphicsItem*>::emplace<QGraphicsItem*&>
                    ((QPodArrayOps<QGraphicsItem*> *)&this->untransformableItems,
                     (this->untransformableItems).d.size,(QGraphicsItem **)&local_58);
          QList<QGraphicsItem_*>::end(&this->untransformableItems);
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (ulong)(this->unindexedItems).d.size);
  }
  QList<QGraphicsItem_*>::clear(&this->unindexedItems);
LAB_00622cbe:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsSceneBspTreeIndexPrivate::_q_updateIndex()
{
    if (!indexTimer.isActive())
        return;

    indexTimer.stop();

    purgeRemovedItems();

     // Add unindexedItems to indexedItems
    for (int i = 0; i < unindexedItems.size(); ++i) {
        if (QGraphicsItem *item = unindexedItems.at(i)) {
            Q_ASSERT(!item->d_ptr->itemDiscovered);
            if (!freeItemIndexes.isEmpty()) {
                int freeIndex = freeItemIndexes.takeFirst();
                item->d_func()->index = freeIndex;
                indexedItems[freeIndex] = item;
            } else {
                item->d_func()->index = indexedItems.size();
                indexedItems << item;
            }
        }
    }

    // Determine whether we should regenerate the BSP tree.
    if (bspTreeDepth == 0) {
        int oldDepth = intmaxlog(lastItemCount);
        bspTreeDepth = intmaxlog(indexedItems.size());
        static const int slack = 100;
        if (bsp.leafCount() == 0 || (oldDepth != bspTreeDepth && qAbs(lastItemCount - indexedItems.size()) > slack)) {
            // ### Crude algorithm.
            regenerateIndex = true;
        }
    }

    // Regenerate the tree.
    if (regenerateIndex) {
        regenerateIndex = false;
        bsp.initialize(sceneRect, bspTreeDepth);
        unindexedItems = indexedItems;
        lastItemCount = indexedItems.size();
    }

    // Insert all unindexed items into the tree.
    for (int i = 0; i < unindexedItems.size(); ++i) {
        if (QGraphicsItem *item = unindexedItems.at(i)) {
            if (item->d_ptr->itemIsUntransformable()) {
                untransformableItems << item;
                continue;
            }
            if (item->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorClipsChildren
                || item->d_ptr->ancestorFlags & QGraphicsItemPrivate::AncestorContainsChildren)
                continue;

            bsp.insertItem(item, item->d_ptr->sceneEffectiveBoundingRect());
        }
    }
    unindexedItems.clear();
}